

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

char * __thiscall
cmCustomCommandGenerator::GetCrossCompilingEmulator(cmCustomCommandGenerator *this,uint c)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  cmGeneratorTarget *this_01;
  char *pcVar3;
  allocator<char> local_39;
  string local_38;
  
  this_00 = this->LG->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_CROSSCOMPILING",&local_39);
  bVar1 = cmMakefile::IsOn(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if ((((bVar1) &&
       (this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                            (this->LG,*(string **)
                                       &(this->CommandLines).
                                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        .
                                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                                        ._M_impl.super__Vector_impl_data._M_start[c].
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ), this_01 != (cmGeneratorTarget *)0x0)) &&
      (TVar2 = cmGeneratorTarget::GetType(this_01), TVar2 == EXECUTABLE)) &&
     (bVar1 = cmGeneratorTarget::IsImported(this_01), !bVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CROSSCOMPILING_EMULATOR",&local_39);
    pcVar3 = cmGeneratorTarget::GetProperty(this_01,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return pcVar3;
  }
  return (char *)0x0;
}

Assistant:

const char* cmCustomCommandGenerator::GetCrossCompilingEmulator(
  unsigned int c) const
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return nullptr;
  }
  std::string const& argv0 = this->CommandLines[c][0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
      !target->IsImported()) {
    return target->GetProperty("CROSSCOMPILING_EMULATOR");
  }
  return nullptr;
}